

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void PPrintTag(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  TidyPrintImpl *pprint_00;
  byte bVar1;
  TidyTagId TVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  Bool BVar6;
  int iVar7;
  AttVal *pAVar8;
  char *node_00;
  uint extraout_EDX;
  TidyPrintImpl *pprint;
  byte *str;
  Node *attr;
  tchar c;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  pprint_00 = &doc->pprint;
  iVar7 = *(int *)((doc->config).value + 0x55);
  local_38 = (ulong)*(uint *)((doc->config).value + 0x62);
  local_40 = (ulong)*(uint *)((doc->config).value + 100);
  str = (byte *)node->element;
  node_00 = (char *)node;
  local_44 = mode;
  AddChar(pprint_00,0x3c);
  if (node->type == EndTag) {
    AddChar(pprint_00,0x2f);
  }
  if (str != (byte *)0x0) {
    for (; bVar1 = *str, bVar1 != 0; str = str + 1) {
      c = (tchar)bVar1;
      if ((char)bVar1 < '\0') {
        uVar5 = prvTidyGetUTF8((ctmbstr)str,&c);
        str = str + uVar5;
      }
      else if (iVar7 != 0) {
        c = prvTidyToUpper(c);
      }
      AddChar(pprint_00,c);
    }
  }
  if ((((*(int *)((doc->config).value + 100) != 0) && (*(int *)((doc->config).value + 0x66) != 0))
      && (pAVar8 = prvTidyGetAttrByName(node,"xml:space"), pAVar8 == (AttVal *)0x0)) &&
     (BVar6 = prvTidyXMLPreserveWhiteSpace(doc,node), BVar6 != no)) {
    node_00 = "preserve";
    prvTidyAddAttribute(doc,node,"xml:space","preserve");
  }
  attr = (Node *)&node->attributes;
  while (uVar4 = local_38, attr = attr->parent, attr != (Node *)0x0) {
    if (attr->attributes == (AttVal *)0x0) {
      if (attr->next == (Node *)0x0) {
        if (attr->content != (Node *)0x0) {
          AddChar(pprint_00,0x20);
          PPrintPhp(doc,indent,attr->content);
        }
      }
      else {
        AddChar(pprint_00,0x20);
        PPrintAsp(doc,indent,attr->next);
      }
    }
    else {
      node_00 = (char *)attr;
      PPrintAttribute(doc,indent,node,(AttVal *)attr);
    }
  }
  local_40 = local_40 | local_38;
  if ((local_40 != 0) &&
     ((node->type == StartEndTag || (BVar6 = prvTidynodeCMIsEmpty(node), BVar6 != no)))) {
    AddChar(pprint_00,0x20);
    AddChar(pprint_00,0x2f);
  }
  AddChar(pprint_00,0x3e);
  if ((node->type != StartEndTag) || (iVar7 = prvTidyHTMLVersion(doc), iVar7 != 0x20000))
  goto LAB_00149871;
  uVar5 = extraout_EDX;
  if (node->tag != (Dict *)0x0) {
    TVar2 = node->tag->id;
    if ((TVar2 - TidyTag_AREA < 0x3e) &&
       (uVar5 = 0x8010405, (0x2084610008010405U >> ((ulong)(TVar2 - TidyTag_AREA) & 0x3f) & 1) != 0)
       ) goto LAB_00149871;
    uVar3 = TVar2 - TidyTag_WBR;
    node_00 = (char *)(ulong)uVar3;
    if (((uVar3 < 0x1f) && (uVar5 = 0x44000101, (0x44000101U >> (uVar3 & 0x1f) & 1) != 0)) ||
       (TVar2 == TidyTag_PARAM)) goto LAB_00149871;
  }
  PPrintEndTag(doc,(uint)node,uVar5,(Node *)node_00);
LAB_00149871:
  uVar5 = local_44;
  if (node->type == StartEndTag && uVar4 == 0) {
    iVar7 = prvTidyHTMLVersion(doc);
    if ((uVar5 & 1) != 0 || iVar7 != 0x20000) {
      return;
    }
  }
  else if ((local_44 & 1) != 0) {
    return;
  }
  uVar3 = *(uint *)((doc->config).value + 0x5d);
  CheckWrapIndent(doc,indent);
  if ((doc->pprint).linelen + indent < uVar3) {
    if (((uVar5 & 8) == 0) &&
       (((BVar6 = prvTidynodeCMIsInline(node), BVar6 == no ||
         ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_BR)))) &&
        (BVar6 = AfterSpace(doc->lexer,node), BVar6 != no)))) {
      (doc->pprint).wraphere = (doc->pprint).linelen;
    }
  }
  else if (((uVar5 & 8) != 0) ||
          (((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_BR)) ||
           (BVar6 = AfterSpace(doc->lexer,node), BVar6 != no)))) {
    PCondFlushLineSmart(doc,indent);
  }
  return;
}

Assistant:

static void PPrintTag( TidyDocImpl* doc,
                       uint mode, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool uc = cfgBool( doc, TidyUpperCaseTags );
    Bool xhtmlOut = cfgBool( doc, TidyXhtmlOut );
    Bool xmlOut = cfgBool( doc, TidyXmlOut );
    tchar c;
    tmbstr s = node->element;

    AddChar( pprint, '<' );

    if ( node->type == EndTag )
        AddChar( pprint, '/' );

    if (s)
    {
        while (*s)
        {
            c = (unsigned char)*s;

            if (c > 0x7F)
                s += TY_(GetUTF8)(s, &c);
            else if (uc)
                c = TY_(ToUpper)(c);

            AddChar(pprint, c);
            ++s;
        }
    }

    PPrintAttrs( doc, indent, node );

    if ( (xmlOut || xhtmlOut) &&
         (node->type == StartEndTag || TY_(nodeCMIsEmpty)(node)) )
    {
        AddChar( pprint, ' ' );   /* Space is NS compatibility hack <br /> */
        AddChar( pprint, '/' );   /* Required end tag marker */
    }

    AddChar( pprint, '>' );

    /*\
     *  Appears this was added for Issue #111, #112, #113, but will now add an end tag
     *  for elements like <img ...> which do NOT have an EndTag, even in html5
     *  See Issue #162 - void elements also get a closing tag, like img, br, ...
     *  A complete list of the void elements in HTML:
     *  area, base, br, col, command, embed, hr, img, input, keygen, link, meta, param, source, track, wbr
    \*/
    if ((node->type == StartEndTag && TY_(HTMLVersion)(doc) == HT50) && !TY_(isVoidElement)(node) )
    {
        PPrintEndTag( doc, mode, indent, node );
    }

    if ( (node->type != StartEndTag || xhtmlOut || (node->type == StartEndTag && TY_(HTMLVersion)(doc) == HT50)) && !(mode & PREFORMATTED) )
    {
        uint wraplen = cfg( doc, TidyWrapLen );
        CheckWrapIndent( doc, indent );

        if ( indent + pprint->linelen < wraplen )
        {
            /* wrap after start tag if is <br/> or if it's not inline.
               Technically, it would be safe to call only AfterSpace.
               However, it would disrupt the existing algorithm. So let's
               leave as is. Note that AfterSpace returns true for non inline
               elements but can still be false for some <br>. So it has to
               stay as well. */
            if (!(mode & NOWRAP)
                && (!TY_(nodeCMIsInline)(node) || nodeIsBR(node))
                && AfterSpace(doc->lexer, node))
            {
                pprint->wraphere = pprint->linelen;
            }
        }
        /* flush the current buffer only if it is known to be safe,
           i.e. it will not introduce some spurious white spaces.
           See bug #996484 */
        else if ( mode & NOWRAP ||
                  nodeIsBR(node) || AfterSpace(doc->lexer, node))
            PCondFlushLineSmart( doc, indent );
    }
}